

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRetF.c
# Opt level: O0

int Aig_ManRetimeMark_rec(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  if ((*(ulong *)&pObj->field_0x18 >> 5 & 1) != 0) {
    return 1;
  }
  iVar1 = Aig_ObjIsCi(pObj);
  if ((iVar1 != 0) || (iVar1 = Aig_ObjIsConst1(pObj), iVar1 != 0)) {
    return 0;
  }
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 != 0) {
    return (uint)(*(ulong *)&pObj->field_0x18 >> 5) & 1;
  }
  Aig_ObjSetTravIdCurrent(p,pObj);
  pAVar2 = Aig_ObjFanin0(pObj);
  iVar1 = Aig_ManRetimeMark_rec(p,pAVar2);
  if (iVar1 != 0) {
    *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf | 0x20;
    return 1;
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 != 0) {
    pAVar2 = Aig_ObjFanin1(pObj);
    iVar1 = Aig_ManRetimeMark_rec(p,pAVar2);
    if (iVar1 != 0) {
      *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 & 0xffffffffffffffdf | 0x20;
      return 1;
    }
  }
  if ((*(ulong *)&pObj->field_0x18 >> 5 & 1) == 0) {
    return 0;
  }
  __assert_fail("pObj->fMarkB == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRetF.c"
                ,0x3a,"int Aig_ManRetimeMark_rec(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Mark the nodes reachable from the PIs in the reverse order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Aig_ManRetimeMark_rec( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    if ( pObj->fMarkB )
        return 1;
    if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
        return 0;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return pObj->fMarkB;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ManRetimeMark_rec( p, Aig_ObjFanin0(pObj) ) )
        return pObj->fMarkB = 1;
    if ( Aig_ObjIsNode(pObj) && Aig_ManRetimeMark_rec( p, Aig_ObjFanin1(pObj) ) )
        return pObj->fMarkB = 1;
    assert( pObj->fMarkB == 0 );
    return 0;
}